

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O2

void __thiscall
TreeNode<ActionObservationHistory>::~TreeNode(TreeNode<ActionObservationHistory> *this)

{
  iterator __position;
  
  this->_vptr_TreeNode = (_func_int **)&PTR__TreeNode_00602098;
  if (this->_m_containedElem != (ActionObservationHistory *)0x0) {
    (*(this->_m_containedElem->super_IndividualHistory).super_History._vptr_History[1])();
  }
  while ((this->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __position._M_node = (this->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (__position._M_node[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)__position._M_node[1]._M_parent + 8))();
      __position._M_node = (this->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
    }
    std::
    _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>,std::_Select1st<std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,TreeNode<ActionObservationHistory>*>>>
                        *)&this->_m_successor,__position);
  }
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_TreeNode<ActionObservationHistory>_*>,_std::_Select1st<std::pair<const_unsigned_long_long,_TreeNode<ActionObservationHistory>_*>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ActionObservationHistory>_*>_>_>
  ::~_Rb_tree(&(this->_m_successor)._M_t);
  return;
}

Assistant:

virtual ~TreeNode()
        {
#if DEBUG_TREENODE
            cerr << "Deleting TreeNode. This node ";
            PrintThisNode();cerr << endl;
#endif
            delete(_m_containedElem);

            while(!_m_successor.empty())
            {
                delete _m_successor.begin()->second; // recursively
                                                     // delete the
                                                     // rest of the
                                                     // tree
                _m_successor.erase(_m_successor.begin());
            }
        }